

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> * __thiscall
cnn::Tensor::batch_matrix
          (Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>
           *__return_storage_ptr__,Tensor *this,uint bid)

{
  uint uVar1;
  float *pfVar2;
  uint uVar3;
  ulong cols;
  
  pfVar2 = this->v;
  uVar1 = (this->d).bd;
  uVar3 = Dim::batch_size(&this->d);
  cols = 1;
  if (1 < (this->d).nd) {
    cols = (ulong)(this->d).d[1];
  }
  Eigen::MapBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>::
  MapBase((MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           *)__return_storage_ptr__,pfVar2 + uVar3 * (bid % uVar1),(ulong)(this->d).d[0],cols);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Map<Eigen::MatrixXf> batch_matrix(unsigned bid) {
    return Eigen::Map<Eigen::MatrixXf>(v + (bid%d.bd)*d.batch_size(), d.rows(), d.cols());
  }